

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP5Writer::MarshalAttributes(BP5Writer *this)

{
  DataType DVar1;
  bool bVar2;
  int iVar3;
  DataType DVar4;
  DataType DVar5;
  pointer pAVar6;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar7;
  undefined8 uVar8;
  Attribute<char> *pAVar9;
  Attribute<signed_char> *pAVar10;
  Attribute<short> *pAVar11;
  Attribute<int> *pAVar12;
  Attribute<long> *pAVar13;
  Attribute<unsigned_char> *pAVar14;
  Attribute<unsigned_short> *pAVar15;
  Attribute<unsigned_int> *pAVar16;
  Attribute<unsigned_long> *pAVar17;
  Attribute<float> *pAVar18;
  Attribute<double> *pAVar19;
  Attribute<std::complex<float>_> *pAVar20;
  long in_RDI;
  void *data_addr_14;
  int element_count_14;
  Attribute<std::complex<double>_> *attribute_14;
  void *data_addr_13;
  int element_count_13;
  Attribute<std::complex<float>_> *attribute_13;
  void *data_addr_12;
  int element_count_12;
  Attribute<long_double> *attribute_12;
  void *data_addr_11;
  int element_count_11;
  Attribute<double> *attribute_11;
  void *data_addr_10;
  int element_count_10;
  Attribute<float> *attribute_10;
  void *data_addr_9;
  int element_count_9;
  Attribute<unsigned_long> *attribute_9;
  void *data_addr_8;
  int element_count_8;
  Attribute<unsigned_int> *attribute_8;
  void *data_addr_7;
  int element_count_7;
  Attribute<unsigned_short> *attribute_7;
  void *data_addr_6;
  int element_count_6;
  Attribute<unsigned_char> *attribute_6;
  void *data_addr_5;
  int element_count_5;
  Attribute<long> *attribute_5;
  void *data_addr_4;
  int element_count_4;
  Attribute<int> *attribute_4;
  void *data_addr_3;
  int element_count_3;
  Attribute<short> *attribute_3;
  void *data_addr_2;
  int element_count_2;
  Attribute<signed_char> *attribute_2;
  void *data_addr_1;
  int element_count_1;
  Attribute<char> *attribute_1;
  value_type *str;
  int i;
  char **tmp;
  void *data_addr;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *attribute;
  int element_count;
  DataType type;
  unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
  *baseAttr;
  string name;
  value_type *attributePair;
  const_iterator __end2;
  const_iterator __begin2;
  AttrMap *__range2;
  AttrMap *attributes;
  ScopedTimer __var2488;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
  *in_stack_fffffffffffff6e8;
  Attribute<std::complex<double>_> *in_stack_fffffffffffff6f0;
  allocator *in_stack_fffffffffffff728;
  size_t in_stack_fffffffffffff730;
  allocator *in_stack_fffffffffffff738;
  DataType in_stack_fffffffffffff744;
  char *in_stack_fffffffffffff748;
  BP5Serializer *in_stack_fffffffffffff750;
  string *in_stack_fffffffffffff790;
  string *in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff7a0;
  DataType in_stack_fffffffffffff7a4;
  IO *in_stack_fffffffffffff7a8;
  allocator local_629;
  string local_628 [39];
  allocator local_601;
  string local_600 [32];
  Attribute<std::complex<double>_> *local_5e0;
  complex<float> *local_5d8;
  undefined4 local_5d0;
  allocator local_5c9;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [32];
  Attribute<std::complex<float>_> *local_580;
  pointer *local_578;
  undefined4 local_570;
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [32];
  BP5Serializer *local_520;
  double *local_518;
  undefined4 local_510;
  allocator local_509;
  string local_508 [39];
  undefined1 local_4e1 [33];
  Attribute<double> *local_4c0;
  float *local_4b8;
  undefined4 local_4b0;
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [32];
  Attribute<float> *local_460;
  unsigned_long *local_458;
  undefined4 local_450;
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [32];
  Attribute<unsigned_long> *local_400;
  uint *local_3f8;
  undefined4 local_3f0;
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [32];
  Attribute<unsigned_int> *local_3a0;
  unsigned_short *local_398;
  undefined4 local_390;
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [32];
  Attribute<unsigned_short> *local_340;
  uchar *local_338;
  undefined4 local_330;
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [32];
  Attribute<unsigned_char> *local_2e0;
  long *local_2d8;
  undefined4 local_2d0;
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [32];
  Attribute<long> *local_280;
  int *local_278;
  undefined4 local_270;
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  Attribute<int> *local_220;
  short *local_218;
  undefined4 local_210;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [32];
  Attribute<short> *local_1c0;
  char *local_1b8;
  undefined4 local_1b0;
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [32];
  Attribute<signed_char> *local_160;
  char *local_158;
  undefined4 local_150;
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [32];
  Attribute<char> *local_100;
  reference local_f8;
  int local_ec;
  void *local_e8;
  void *local_e0;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  int local_80;
  DataType local_7c;
  unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
  *local_78;
  string local_70 [32];
  reference local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_40;
  AttrMap *local_38;
  undefined4 local_2c;
  AttrMap *local_28;
  
  if ((MarshalAttributes()::__var488 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&MarshalAttributes()::__var488), iVar3 != 0)) {
    MarshalAttributes::__var488 = (void *)ps_timer_create_("BP5Writer::MarshalAttributes");
    __cxa_guard_release(&MarshalAttributes()::__var488);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  local_28 = IO::GetAttributes_abi_cxx11_(*(IO **)(in_RDI + 0x28));
  if ((*(byte *)(in_RDI + 0xc40) & 1) == 0) {
    local_2c = 1;
  }
  else {
    *(undefined1 *)(in_RDI + 0xc40) = 0;
    local_38 = local_28;
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
         ::begin(in_stack_fffffffffffff6e8);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
         ::end(in_stack_fffffffffffff6e8);
    while (bVar2 = std::__detail::operator!=(&local_40,&local_48), bVar2) {
      local_50 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                 ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                              *)0xa85ff4);
      std::__cxx11::string::string(local_70,(string *)local_50);
      local_78 = &local_50->second;
      pAVar6 = std::
               unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
               ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                             *)0xa86034);
      local_7c = pAVar6->m_Type;
      local_80 = -1;
      pAVar6 = std::
               unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
               ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                             *)0xa8605a);
      if ((pAVar6->m_IsSingleValue & 1U) == 0) {
        pAVar6 = std::
                 unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                 ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                               *)0xa8606d);
        local_80 = (int)pAVar6->m_Elements;
      }
      DVar1 = local_7c;
      if (local_7c != None) {
        DVar4 = helper::GetDataType<std::__cxx11::string>();
        DVar5 = local_7c;
        if (DVar1 == DVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a8,"",&local_a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_d0,"/",&local_d1);
          pAVar7 = IO::InquireAttribute<std::__cxx11::string>
                             (in_stack_fffffffffffff7a8,
                              (string *)
                              CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                              in_stack_fffffffffffff798,in_stack_fffffffffffff790);
          std::__cxx11::string::~string(local_d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_d1);
          std::__cxx11::string::~string(local_a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_a9);
          local_88 = pAVar7;
          if (((pAVar7->super_AttributeBase).m_IsSingleValue & 1U) == 0) {
            local_e8 = malloc((long)local_80 << 3);
            for (local_ec = 0; local_ec < local_80; local_ec = local_ec + 1) {
              local_f8 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&local_88->m_DataArray,(long)local_ec);
              uVar8 = std::__cxx11::string::c_str();
              *(undefined8 *)((long)local_e8 + (long)local_ec * 8) = uVar8;
            }
            local_e0 = local_e8;
          }
          else {
            local_e0 = (void *)std::__cxx11::string::c_str();
          }
          std::__cxx11::string::c_str();
          adios2::format::BP5Serializer::MarshalAttribute
                    (in_stack_fffffffffffff750,in_stack_fffffffffffff748,in_stack_fffffffffffff744,
                     (size_t)in_stack_fffffffffffff738,in_stack_fffffffffffff730,
                     in_stack_fffffffffffff728);
          if (((local_88->super_AttributeBase).m_IsSingleValue & 1U) == 0) {
            free(local_e0);
          }
        }
        else {
          DVar4 = helper::GetDataType<char>();
          DVar1 = local_7c;
          if (DVar5 == DVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_120,"",&local_121);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_148,"/",&local_149);
            pAVar9 = IO::InquireAttribute<char>
                               (in_stack_fffffffffffff7a8,
                                (string *)
                                CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                                in_stack_fffffffffffff798,in_stack_fffffffffffff790);
            std::__cxx11::string::~string(local_148);
            std::allocator<char>::~allocator((allocator<char> *)&local_149);
            std::__cxx11::string::~string(local_120);
            std::allocator<char>::~allocator((allocator<char> *)&local_121);
            local_150 = 0xffffffff;
            local_158 = &pAVar9->m_DataSingleValue;
            local_100 = pAVar9;
            if (((pAVar9->super_AttributeBase).m_IsSingleValue & 1U) == 0) {
              local_150 = (undefined4)(pAVar9->super_AttributeBase).m_Elements;
              local_158 = std::vector<char,_std::allocator<char>_>::data
                                    ((vector<char,_std::allocator<char>_> *)0xa864bf);
            }
            std::__cxx11::string::c_str();
            adios2::format::BP5Serializer::MarshalAttribute
                      (in_stack_fffffffffffff750,in_stack_fffffffffffff748,in_stack_fffffffffffff744
                       ,(size_t)in_stack_fffffffffffff738,in_stack_fffffffffffff730,
                       in_stack_fffffffffffff728);
          }
          else {
            DVar4 = helper::GetDataType<signed_char>();
            DVar5 = local_7c;
            if (DVar1 == DVar4) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_180,"",&local_181);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1a8,"/",&local_1a9);
              pAVar10 = IO::InquireAttribute<signed_char>
                                  (in_stack_fffffffffffff7a8,
                                   (string *)
                                   CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                                   in_stack_fffffffffffff798,in_stack_fffffffffffff790);
              std::__cxx11::string::~string(local_1a8);
              std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
              std::__cxx11::string::~string(local_180);
              std::allocator<char>::~allocator((allocator<char> *)&local_181);
              local_1b0 = 0xffffffff;
              local_1b8 = &pAVar10->m_DataSingleValue;
              local_160 = pAVar10;
              if (((pAVar10->super_AttributeBase).m_IsSingleValue & 1U) == 0) {
                local_1b0 = (undefined4)(pAVar10->super_AttributeBase).m_Elements;
                local_1b8 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                                      ((vector<signed_char,_std::allocator<signed_char>_> *)0xa866dd
                                      );
              }
              std::__cxx11::string::c_str();
              adios2::format::BP5Serializer::MarshalAttribute
                        (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                         in_stack_fffffffffffff744,(size_t)in_stack_fffffffffffff738,
                         in_stack_fffffffffffff730,in_stack_fffffffffffff728);
            }
            else {
              DVar4 = helper::GetDataType<short>();
              DVar1 = local_7c;
              if (DVar5 == DVar4) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1e0,"",&local_1e1);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_208,"/",&local_209);
                pAVar11 = IO::InquireAttribute<short>
                                    (in_stack_fffffffffffff7a8,
                                     (string *)
                                     CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                                     in_stack_fffffffffffff798,in_stack_fffffffffffff790);
                std::__cxx11::string::~string(local_208);
                std::allocator<char>::~allocator((allocator<char> *)&local_209);
                std::__cxx11::string::~string(local_1e0);
                std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
                local_210 = 0xffffffff;
                local_218 = &pAVar11->m_DataSingleValue;
                local_1c0 = pAVar11;
                if (((pAVar11->super_AttributeBase).m_IsSingleValue & 1U) == 0) {
                  local_210 = (undefined4)(pAVar11->super_AttributeBase).m_Elements;
                  local_218 = std::vector<short,_std::allocator<short>_>::data
                                        ((vector<short,_std::allocator<short>_> *)0xa868fb);
                }
                std::__cxx11::string::c_str();
                adios2::format::BP5Serializer::MarshalAttribute
                          (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                           in_stack_fffffffffffff744,(size_t)in_stack_fffffffffffff738,
                           in_stack_fffffffffffff730,in_stack_fffffffffffff728);
              }
              else {
                DVar4 = helper::GetDataType<int>();
                DVar5 = local_7c;
                if (DVar1 == DVar4) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_240,"",&local_241);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_268,"/",&local_269);
                  pAVar12 = IO::InquireAttribute<int>
                                      (in_stack_fffffffffffff7a8,
                                       (string *)
                                       CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0)
                                       ,in_stack_fffffffffffff798,in_stack_fffffffffffff790);
                  std::__cxx11::string::~string(local_268);
                  std::allocator<char>::~allocator((allocator<char> *)&local_269);
                  std::__cxx11::string::~string(local_240);
                  std::allocator<char>::~allocator((allocator<char> *)&local_241);
                  local_270 = 0xffffffff;
                  local_278 = &pAVar12->m_DataSingleValue;
                  local_220 = pAVar12;
                  if (((pAVar12->super_AttributeBase).m_IsSingleValue & 1U) == 0) {
                    local_270 = (undefined4)(pAVar12->super_AttributeBase).m_Elements;
                    local_278 = std::vector<int,_std::allocator<int>_>::data
                                          ((vector<int,_std::allocator<int>_> *)0xa86b19);
                  }
                  std::__cxx11::string::c_str();
                  adios2::format::BP5Serializer::MarshalAttribute
                            (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                             in_stack_fffffffffffff744,(size_t)in_stack_fffffffffffff738,
                             in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                }
                else {
                  DVar4 = helper::GetDataType<long>();
                  DVar1 = local_7c;
                  if (DVar5 == DVar4) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_2a0,"",&local_2a1);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_2c8,"/",&local_2c9);
                    pAVar13 = IO::InquireAttribute<long>
                                        (in_stack_fffffffffffff7a8,
                                         (string *)
                                         CONCAT44(in_stack_fffffffffffff7a4,
                                                  in_stack_fffffffffffff7a0),
                                         in_stack_fffffffffffff798,in_stack_fffffffffffff790);
                    std::__cxx11::string::~string(local_2c8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
                    std::__cxx11::string::~string(local_2a0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
                    local_2d0 = 0xffffffff;
                    local_2d8 = &pAVar13->m_DataSingleValue;
                    local_280 = pAVar13;
                    if (((pAVar13->super_AttributeBase).m_IsSingleValue & 1U) == 0) {
                      local_2d0 = (undefined4)(pAVar13->super_AttributeBase).m_Elements;
                      local_2d8 = std::vector<long,_std::allocator<long>_>::data
                                            ((vector<long,_std::allocator<long>_> *)0xa86d37);
                    }
                    std::__cxx11::string::c_str();
                    adios2::format::BP5Serializer::MarshalAttribute
                              (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                               in_stack_fffffffffffff744,(size_t)in_stack_fffffffffffff738,
                               in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                  }
                  else {
                    DVar4 = helper::GetDataType<unsigned_char>();
                    DVar5 = local_7c;
                    if (DVar1 == DVar4) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_300,"",&local_301);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_328,"/",&local_329);
                      pAVar14 = IO::InquireAttribute<unsigned_char>
                                          (in_stack_fffffffffffff7a8,
                                           (string *)
                                           CONCAT44(in_stack_fffffffffffff7a4,
                                                    in_stack_fffffffffffff7a0),
                                           in_stack_fffffffffffff798,in_stack_fffffffffffff790);
                      std::__cxx11::string::~string(local_328);
                      std::allocator<char>::~allocator((allocator<char> *)&local_329);
                      std::__cxx11::string::~string(local_300);
                      std::allocator<char>::~allocator((allocator<char> *)&local_301);
                      local_330 = 0xffffffff;
                      local_338 = &pAVar14->m_DataSingleValue;
                      local_2e0 = pAVar14;
                      if (((pAVar14->super_AttributeBase).m_IsSingleValue & 1U) == 0) {
                        local_330 = (undefined4)(pAVar14->super_AttributeBase).m_Elements;
                        local_338 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                              ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)0xa86f55);
                      }
                      std::__cxx11::string::c_str();
                      adios2::format::BP5Serializer::MarshalAttribute
                                (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                                 in_stack_fffffffffffff744,(size_t)in_stack_fffffffffffff738,
                                 in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                    }
                    else {
                      DVar4 = helper::GetDataType<unsigned_short>();
                      DVar1 = local_7c;
                      if (DVar5 == DVar4) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_360,"",&local_361);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_388,"/",&local_389);
                        pAVar15 = IO::InquireAttribute<unsigned_short>
                                            (in_stack_fffffffffffff7a8,
                                             (string *)
                                             CONCAT44(in_stack_fffffffffffff7a4,
                                                      in_stack_fffffffffffff7a0),
                                             in_stack_fffffffffffff798,in_stack_fffffffffffff790);
                        std::__cxx11::string::~string(local_388);
                        std::allocator<char>::~allocator((allocator<char> *)&local_389);
                        std::__cxx11::string::~string(local_360);
                        std::allocator<char>::~allocator((allocator<char> *)&local_361);
                        local_390 = 0xffffffff;
                        local_398 = &pAVar15->m_DataSingleValue;
                        local_340 = pAVar15;
                        if (((pAVar15->super_AttributeBase).m_IsSingleValue & 1U) == 0) {
                          local_390 = (undefined4)(pAVar15->super_AttributeBase).m_Elements;
                          local_398 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                                      data((vector<unsigned_short,_std::allocator<unsigned_short>_>
                                            *)0xa87173);
                        }
                        std::__cxx11::string::c_str();
                        adios2::format::BP5Serializer::MarshalAttribute
                                  (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                                   in_stack_fffffffffffff744,(size_t)in_stack_fffffffffffff738,
                                   in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                      }
                      else {
                        DVar4 = helper::GetDataType<unsigned_int>();
                        DVar5 = local_7c;
                        if (DVar1 == DVar4) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_3c0,"",&local_3c1);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_3e8,"/",&local_3e9);
                          pAVar16 = IO::InquireAttribute<unsigned_int>
                                              (in_stack_fffffffffffff7a8,
                                               (string *)
                                               CONCAT44(in_stack_fffffffffffff7a4,
                                                        in_stack_fffffffffffff7a0),
                                               in_stack_fffffffffffff798,in_stack_fffffffffffff790);
                          std::__cxx11::string::~string(local_3e8);
                          std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
                          std::__cxx11::string::~string(local_3c0);
                          std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
                          local_3f0 = 0xffffffff;
                          local_3f8 = &pAVar16->m_DataSingleValue;
                          local_3a0 = pAVar16;
                          if (((pAVar16->super_AttributeBase).m_IsSingleValue & 1U) == 0) {
                            local_3f0 = (undefined4)(pAVar16->super_AttributeBase).m_Elements;
                            local_3f8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                                        data((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                             0xa87391);
                          }
                          std::__cxx11::string::c_str();
                          adios2::format::BP5Serializer::MarshalAttribute
                                    (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                                     in_stack_fffffffffffff744,(size_t)in_stack_fffffffffffff738,
                                     in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                        }
                        else {
                          DVar4 = helper::GetDataType<unsigned_long>();
                          DVar1 = local_7c;
                          if (DVar5 == DVar4) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_420,"",&local_421);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_448,"/",&local_449);
                            pAVar17 = IO::InquireAttribute<unsigned_long>
                                                (in_stack_fffffffffffff7a8,
                                                 (string *)
                                                 CONCAT44(in_stack_fffffffffffff7a4,
                                                          in_stack_fffffffffffff7a0),
                                                 in_stack_fffffffffffff798,in_stack_fffffffffffff790
                                                );
                            std::__cxx11::string::~string(local_448);
                            std::allocator<char>::~allocator((allocator<char> *)&local_449);
                            std::__cxx11::string::~string(local_420);
                            std::allocator<char>::~allocator((allocator<char> *)&local_421);
                            local_450 = 0xffffffff;
                            local_458 = &pAVar17->m_DataSingleValue;
                            local_400 = pAVar17;
                            if (((pAVar17->super_AttributeBase).m_IsSingleValue & 1U) == 0) {
                              local_450 = (undefined4)(pAVar17->super_AttributeBase).m_Elements;
                              local_458 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>
                                          ::data((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)0xa875af);
                            }
                            std::__cxx11::string::c_str();
                            adios2::format::BP5Serializer::MarshalAttribute
                                      (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                                       in_stack_fffffffffffff744,(size_t)in_stack_fffffffffffff738,
                                       in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                          }
                          else {
                            DVar5 = helper::GetDataType<float>();
                            if (DVar1 == DVar5) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_480,"",&local_481);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_4a8,"/",&local_4a9);
                              pAVar18 = IO::InquireAttribute<float>
                                                  (in_stack_fffffffffffff7a8,
                                                   (string *)
                                                   CONCAT44(in_stack_fffffffffffff7a4,
                                                            in_stack_fffffffffffff7a0),
                                                   in_stack_fffffffffffff798,
                                                   in_stack_fffffffffffff790);
                              std::__cxx11::string::~string(local_4a8);
                              std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
                              std::__cxx11::string::~string(local_480);
                              std::allocator<char>::~allocator((allocator<char> *)&local_481);
                              local_4b0 = 0xffffffff;
                              local_4b8 = &pAVar18->m_DataSingleValue;
                              local_460 = pAVar18;
                              if (((pAVar18->super_AttributeBase).m_IsSingleValue & 1U) == 0) {
                                local_4b0 = (undefined4)(pAVar18->super_AttributeBase).m_Elements;
                                local_4b8 = std::vector<float,_std::allocator<float>_>::data
                                                      ((vector<float,_std::allocator<float>_> *)
                                                       0xa877cd);
                              }
                              in_stack_fffffffffffff7a8 = (IO *)(in_RDI + 0x290);
                              std::__cxx11::string::c_str();
                              adios2::format::BP5Serializer::MarshalAttribute
                                        (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                                         in_stack_fffffffffffff744,(size_t)in_stack_fffffffffffff738
                                         ,in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                            }
                            else {
                              in_stack_fffffffffffff7a4 = local_7c;
                              DVar5 = helper::GetDataType<double>();
                              DVar1 = local_7c;
                              if (in_stack_fffffffffffff7a4 == DVar5) {
                                in_stack_fffffffffffff790 = *(string **)(in_RDI + 0x28);
                                in_stack_fffffffffffff798 = (string *)local_4e1;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          ((string *)(local_4e1 + 1),"",
                                           (allocator *)in_stack_fffffffffffff798);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_508,"/",&local_509);
                                pAVar19 = IO::InquireAttribute<double>
                                                    (in_stack_fffffffffffff7a8,
                                                     (string *)
                                                     CONCAT44(in_stack_fffffffffffff7a4,
                                                              in_stack_fffffffffffff7a0),
                                                     in_stack_fffffffffffff798,
                                                     in_stack_fffffffffffff790);
                                std::__cxx11::string::~string(local_508);
                                std::allocator<char>::~allocator((allocator<char> *)&local_509);
                                std::__cxx11::string::~string((string *)(local_4e1 + 1));
                                std::allocator<char>::~allocator((allocator<char> *)local_4e1);
                                local_510 = 0xffffffff;
                                local_518 = &pAVar19->m_DataSingleValue;
                                local_4c0 = pAVar19;
                                if (((pAVar19->super_AttributeBase).m_IsSingleValue & 1U) == 0) {
                                  local_510 = (undefined4)(pAVar19->super_AttributeBase).m_Elements;
                                  local_518 = std::vector<double,_std::allocator<double>_>::data
                                                        ((vector<double,_std::allocator<double>_> *)
                                                         0xa879eb);
                                }
                                std::__cxx11::string::c_str();
                                adios2::format::BP5Serializer::MarshalAttribute
                                          (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                                           in_stack_fffffffffffff744,
                                           (size_t)in_stack_fffffffffffff738,
                                           in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                              }
                              else {
                                DVar5 = helper::GetDataType<long_double>();
                                if (DVar1 == DVar5) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_540,"",&local_541);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_568,"/",&local_569);
                                  in_stack_fffffffffffff750 =
                                       (BP5Serializer *)
                                       IO::InquireAttribute<long_double>
                                                 (in_stack_fffffffffffff7a8,
                                                  (string *)
                                                  CONCAT44(in_stack_fffffffffffff7a4,
                                                           in_stack_fffffffffffff7a0),
                                                  in_stack_fffffffffffff798,
                                                  in_stack_fffffffffffff790);
                                  std::__cxx11::string::~string(local_568);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_569);
                                  std::__cxx11::string::~string(local_540);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_541);
                                  local_570 = 0xffffffff;
                                  local_578 = &(in_stack_fffffffffffff750->DeferredExterns).
                                               super__Vector_base<adios2::format::BP5Serializer::DeferredExtern,_std::allocator<adios2::format::BP5Serializer::DeferredExtern>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                  local_520 = in_stack_fffffffffffff750;
                                  if (((ulong)(in_stack_fffffffffffff750->NewStructFormats).
                                              super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start & 1) == 0) {
                                    local_570 = SUB84(in_stack_fffffffffffff750->
                                                      GenericAttributeFormat,0);
                                    local_578 = (pointer *)
                                                std::
                                                vector<long_double,_std::allocator<long_double>_>::
                                                data((
                                                  vector<long_double,_std::allocator<long_double>_>
                                                  *)0xa87bf7);
                                  }
                                  in_stack_fffffffffffff748 = (char *)(in_RDI + 0x290);
                                  std::__cxx11::string::c_str();
                                  adios2::format::BP5Serializer::MarshalAttribute
                                            (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                                             in_stack_fffffffffffff744,
                                             (size_t)in_stack_fffffffffffff738,
                                             in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                                }
                                else {
                                  in_stack_fffffffffffff744 = local_7c;
                                  DVar5 = helper::GetDataType<std::complex<float>>();
                                  DVar1 = local_7c;
                                  if (in_stack_fffffffffffff744 == DVar5) {
                                    in_stack_fffffffffffff730 = *(size_t *)(in_RDI + 0x28);
                                    in_stack_fffffffffffff738 = &local_5a1;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              (local_5a0,"",in_stack_fffffffffffff738);
                                    in_stack_fffffffffffff728 = &local_5c9;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              (local_5c8,"/",in_stack_fffffffffffff728);
                                    pAVar20 = IO::InquireAttribute<std::complex<float>>
                                                        (in_stack_fffffffffffff7a8,
                                                         (string *)
                                                         CONCAT44(in_stack_fffffffffffff7a4,
                                                                  in_stack_fffffffffffff7a0),
                                                         in_stack_fffffffffffff798,
                                                         in_stack_fffffffffffff790);
                                    std::__cxx11::string::~string(local_5c8);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
                                    std::__cxx11::string::~string(local_5a0);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
                                    local_5d0 = 0xffffffff;
                                    local_5d8 = &pAVar20->m_DataSingleValue;
                                    local_580 = pAVar20;
                                    if (((pAVar20->super_AttributeBase).m_IsSingleValue & 1U) == 0)
                                    {
                                      local_5d0 = (undefined4)
                                                  (pAVar20->super_AttributeBase).m_Elements;
                                      local_5d8 = std::
                                                  vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                                  ::data((
                                                  vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                                  *)0xa87df1);
                                    }
                                    std::__cxx11::string::c_str();
                                    adios2::format::BP5Serializer::MarshalAttribute
                                              (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                                               in_stack_fffffffffffff744,
                                               (size_t)in_stack_fffffffffffff738,
                                               in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                                  }
                                  else {
                                    DVar5 = helper::GetDataType<std::complex<double>>();
                                    if (DVar1 == DVar5) {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string(local_600,"",&local_601);
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string(local_628,"/",&local_629);
                                      in_stack_fffffffffffff6f0 =
                                           IO::InquireAttribute<std::complex<double>>
                                                     (in_stack_fffffffffffff7a8,
                                                      (string *)
                                                      CONCAT44(in_stack_fffffffffffff7a4,
                                                               in_stack_fffffffffffff7a0),
                                                      in_stack_fffffffffffff798,
                                                      in_stack_fffffffffffff790);
                                      std::__cxx11::string::~string(local_628);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_629);
                                      std::__cxx11::string::~string(local_600);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_601);
                                      local_5e0 = in_stack_fffffffffffff6f0;
                                      if (((in_stack_fffffffffffff6f0->super_AttributeBase).
                                           m_IsSingleValue & 1U) == 0) {
                                        std::
                                        vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                        ::data((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                                *)0xa87feb);
                                      }
                                      std::__cxx11::string::c_str();
                                      adios2::format::BP5Serializer::MarshalAttribute
                                                (in_stack_fffffffffffff750,in_stack_fffffffffffff748
                                                 ,in_stack_fffffffffffff744,
                                                 (size_t)in_stack_fffffffffffff738,
                                                 in_stack_fffffffffffff730,in_stack_fffffffffffff728
                                                );
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string(local_70);
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                    *)in_stack_fffffffffffff6f0);
    }
    local_2c = 0;
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_fffffffffffff6f0);
  return;
}

Assistant:

void BP5Writer::MarshalAttributes()
{
    PERFSTUBS_SCOPED_TIMER("BP5Writer::MarshalAttributes");
    const auto &attributes = m_IO.GetAttributes();

    // if there are no new attributes, nothing to do
    if (!m_MarshalAttributesNecessary)
    {
        return;
    }
    m_MarshalAttributesNecessary = false;

    for (const auto &attributePair : attributes)
    {
        const std::string name(attributePair.first);
        auto baseAttr = &attributePair.second;
        const DataType type((*baseAttr)->m_Type);
        int element_count = -1;

        if (!attributePair.second->m_IsSingleValue)
        {
            element_count = (int)(*baseAttr)->m_Elements;
        }

        if (type == DataType::None)
        {
        }
        else if (type == helper::GetDataType<std::string>())
        {
            core::Attribute<std::string> &attribute = *m_IO.InquireAttribute<std::string>(name);
            void *data_addr;
            if (attribute.m_IsSingleValue)
            {
                data_addr = (void *)attribute.m_DataSingleValue.c_str();
            }
            else
            {
                const char **tmp = (const char **)malloc(sizeof(char *) * element_count);
                for (int i = 0; i < element_count; i++)
                {
                    auto str = &attribute.m_DataArray[i];
                    tmp[i] = str->c_str();
                }
                // tmp will be free'd after final attribute marshalling
                data_addr = (void *)tmp;
            }

            m_BP5Serializer.MarshalAttribute(name.c_str(), type, sizeof(char *), element_count,
                                             data_addr);
            if (!attribute.m_IsSingleValue)
            {
                // array of strings
                free(data_addr);
            }
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        core::Attribute<T> &attribute = *m_IO.InquireAttribute<T>(name);                           \
        int element_count = -1;                                                                    \
        void *data_addr = &attribute.m_DataSingleValue;                                            \
        if (!attribute.m_IsSingleValue)                                                            \
        {                                                                                          \
            element_count = (int)attribute.m_Elements;                                             \
            data_addr = attribute.m_DataArray.data();                                              \
        }                                                                                          \
        m_BP5Serializer.MarshalAttribute(attribute.m_Name.c_str(), type, sizeof(T), element_count, \
                                         data_addr);                                               \
    }

        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
    }
}